

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall
spv::Instruction::dump(Instruction *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *out)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar1;
  const_reference __x;
  int local_24;
  Op local_20;
  int op;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  uint wordCount;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *out_local;
  Instruction *this_local;
  
  op = 1;
  if (this->typeId != 0) {
    op = 2;
  }
  if (this->resultId != 0) {
    op = op + 1;
  }
  pvStack_18 = out;
  out_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->operands);
  op = (int)sVar1 + op;
  local_20 = op * 0x10000 | this->opCode;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvStack_18,&local_20);
  if (this->typeId != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvStack_18,&this->typeId);
  }
  if (this->resultId != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvStack_18,&this->resultId);
  }
  local_24 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->operands);
    this_00 = pvStack_18;
    if ((int)sVar1 <= local_24) break;
    __x = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    (&this->operands,(long)local_24);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,__x);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void dump(std::vector<unsigned int>& out) const
    {
        // Compute the wordCount
        unsigned int wordCount = 1;
        if (typeId)
            ++wordCount;
        if (resultId)
            ++wordCount;
        wordCount += (unsigned int)operands.size();

        // Write out the beginning of the instruction
        out.push_back(((wordCount) << WordCountShift) | opCode);
        if (typeId)
            out.push_back(typeId);
        if (resultId)
            out.push_back(resultId);

        // Write out the operands
        for (int op = 0; op < (int)operands.size(); ++op)
            out.push_back(operands[op]);
    }